

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void __thiscall google::protobuf::internal::LogMessage::Finish(LogMessage *this)

{
  FatalException *this_00;
  
  if ((this->level_ == LOGLEVEL_DFATAL) || (log_silencer_count_ < 1)) {
    (*(code *)log_handler__abi_cxx11_)(this->level_,this->filename_,this->line_,&this->message_);
  }
  if (this->level_ != LOGLEVEL_DFATAL) {
    return;
  }
  this_00 = (FatalException *)__cxa_allocate_exception(0x38);
  FatalException::FatalException(this_00,this->filename_,this->line_,&this->message_);
  __cxa_throw(this_00,&FatalException::typeinfo,FatalException::~FatalException);
}

Assistant:

void LogMessage::Finish() {
  bool suppress = false;

  if (level_ != LOGLEVEL_FATAL) {
    suppress = log_silencer_count_ > 0;
  }

  if (!suppress) {
    log_handler_(level_, filename_, line_, message_);
  }

  if (level_ == LOGLEVEL_FATAL) {
#if PROTOBUF_USE_EXCEPTIONS
    throw FatalException(filename_, line_, message_);
#else
    abort();
#endif
  }
}